

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O0

void __thiscall OpenMD::StringTokenizer::skipToken(StringTokenizer *this)

{
  bool bVar1;
  StringTokenizer *in_RDI;
  undefined6 in_stack_ffffffffffffffd8;
  byte in_stack_ffffffffffffffde;
  char in_stack_ffffffffffffffdf;
  char c;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe8;
  
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_RDI,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_ffffffffffffffdf,
                                 CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)));
  if (bVar1) {
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_RDI,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffffdf,
                                     CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)))
      ;
      in_stack_ffffffffffffffdf = false;
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&in_RDI->currentPos_);
        in_stack_ffffffffffffffdf = isDelimiter(in_RDI,in_stack_ffffffffffffffdf);
      }
      if ((bool)in_stack_ffffffffffffffdf == false) {
        c = '\0';
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_RDI,
                             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT17(c,CONCAT16(in_stack_ffffffffffffffde,
                                                    in_stack_ffffffffffffffd8)));
          in_stack_ffffffffffffffde = 0;
          if (bVar1) {
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&in_RDI->currentPos_);
            bVar1 = isDelimiter(in_RDI,c);
            in_stack_ffffffffffffffde = bVar1 ^ 0xff;
          }
          if ((in_stack_ffffffffffffffde & 1) == 0) break;
          in_stack_ffffffffffffffe8 =
               __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++(in_stack_ffffffffffffffe8._M_current,(int)((ulong)in_RDI >> 0x20));
        }
        return;
      }
      if ((in_RDI->returnTokens_ & 1U) != 0) break;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&in_RDI->currentPos_);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffffe8._M_current,(int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void StringTokenizer::skipToken() {
    if (currentPos_ != end_) {
      while (currentPos_ != end_ && isDelimiter(*currentPos_)) {
        if (returnTokens_) {
          currentPos_++;
          return;
        }

        ++currentPos_;
      }

      while (currentPos_ != end_ && !isDelimiter(*currentPos_)) {
        currentPos_++;
      }
    }
  }